

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O1

Violation __thiscall
mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::
ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>> *this,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  double dVar1;
  int iVar2;
  double dVar3;
  Violation VVar4;
  
  dVar3 = AlgebraicExpression<mp::LinTerms>::
          ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    ((AlgebraicExpression<mp::LinTerms> *)(this + 0x20),x);
  iVar2 = *(int *)(this + 0xa0);
  dVar1 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2];
  if (dVar1 - (x->lb_).data_[iVar2] <= x->feastol_) {
    dVar3 = -dVar3;
  }
  else if (x->feastol_ < -(dVar1 - (x->ub_).data_[iVar2])) {
    dVar3 = ABS(dVar3);
  }
  VVar4.valX_ = 0.0;
  VVar4.viol_ = dVar3;
  return VVar4;
}

Assistant:

Violation ComputeViolation(const VarInfo& x) const {
    auto ve = compl_expr_.ComputeValue(x);
    if (x.is_at_lb(compl_var_))
      return {-ve, 0.0};
    else if (x.is_at_ub(compl_var_))
      return {ve, 0.0};
    return {std::fabs(ve), 0.0};
  }